

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O0

TimingControl *
slang::ast::BlockEventListControl::fromSyntax
          (BlockEventExpressionSyntax *syntax,ASTContext *context)

{
  undefined1 uVar1;
  int iVar2;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  SyntaxNode *in_RDI;
  BinaryBlockEventExpressionSyntax *bin;
  BlockEventExpressionSyntax *curr;
  anon_class_24_3_a13afc8e addEvent;
  SmallVector<slang::ast::BlockEventListControl::Event,_4UL> events;
  Compilation *comp;
  TimingControl *in_stack_fffffffffffffeb8;
  Compilation *in_stack_fffffffffffffec0;
  span<slang::ast::BlockEventListControl::Event,_18446744073709551615UL> *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  PrimaryBlockEventExpressionSyntax *in_stack_ffffffffffffff20;
  BinaryBlockEventExpressionSyntax *in_stack_ffffffffffffff28;
  SyntaxNode *local_98;
  SmallVectorBase<slang::ast::BlockEventListControl::Event> local_78 [2];
  Compilation *local_20;
  SyntaxNode *local_10;
  BlockEventListControl *local_8;
  SourceRange *args_1;
  
  local_10 = in_RDI;
  local_20 = ASTContext::getCompilation((ASTContext *)0x4c1a04);
  SmallVector<slang::ast::BlockEventListControl::Event,_4UL>::SmallVector
            ((SmallVector<slang::ast::BlockEventListControl::Event,_4UL> *)0x4c1a19);
  local_98 = local_10;
  do {
    if (local_98->kind != BinaryBlockEventExpression) {
      slang::syntax::SyntaxNode::as<slang::syntax::PrimaryBlockEventExpressionSyntax>(local_98);
      uVar1 = fromSyntax::anon_class_24_3_a13afc8e::operator()
                        ((anon_class_24_3_a13afc8e *)in_stack_ffffffffffffff28,
                         in_stack_ffffffffffffff20);
      if ((bool)uVar1) {
        iVar2 = SmallVectorBase<slang::ast::BlockEventListControl::Event>::copy
                          (local_78,(EVP_PKEY_CTX *)local_20,src);
        args_1 = (SourceRange *)CONCAT44(extraout_var,iVar2);
        slang::syntax::SyntaxNode::sourceRange
                  ((SyntaxNode *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
        local_8 = BumpAllocator::
                  emplace<slang::ast::BlockEventListControl,std::span<slang::ast::BlockEventListControl::Event,18446744073709551615ul>,slang::SourceRange>
                            ((BumpAllocator *)CONCAT17(uVar1,in_stack_fffffffffffffef0),
                             in_stack_fffffffffffffee8,args_1);
      }
      else {
        local_8 = (BlockEventListControl *)
                  TimingControl::badCtrl(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      }
LAB_004c1c6a:
      SmallVector<slang::ast::BlockEventListControl::Event,_4UL>::~SmallVector
                ((SmallVector<slang::ast::BlockEventListControl::Event,_4UL> *)0x4c1c77);
      return &local_8->super_TimingControl;
    }
    in_stack_ffffffffffffff28 =
         slang::syntax::SyntaxNode::as<slang::syntax::BinaryBlockEventExpressionSyntax>(local_98);
    in_stack_ffffffffffffff20 =
         (PrimaryBlockEventExpressionSyntax *)
         not_null<slang::syntax::BlockEventExpressionSyntax_*>::operator->
                   ((not_null<slang::syntax::BlockEventExpressionSyntax_*> *)0x4c1a9c);
    slang::syntax::SyntaxNode::as<slang::syntax::PrimaryBlockEventExpressionSyntax>
              ((SyntaxNode *)in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff17 =
         fromSyntax::anon_class_24_3_a13afc8e::operator()
                   ((anon_class_24_3_a13afc8e *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20)
    ;
    if (!(bool)in_stack_ffffffffffffff17) {
      local_8 = (BlockEventListControl *)
                TimingControl::badCtrl(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      goto LAB_004c1c6a;
    }
    local_98 = &not_null::operator_cast_to_BlockEventExpressionSyntax_
                          ((not_null<slang::syntax::BlockEventExpressionSyntax_*> *)0x4c1b42)->
                super_SyntaxNode;
  } while( true );
}

Assistant:

TimingControl& BlockEventListControl::fromSyntax(const BlockEventExpressionSyntax& syntax,
                                                 const ASTContext& context) {
    auto& comp = context.getCompilation();
    SmallVector<Event, 4> events;

    auto addEvent = [&](const PrimaryBlockEventExpressionSyntax& evSyntax) {
        auto& expr = ArbitrarySymbolExpression::fromSyntax(comp, *evSyntax.name, context);
        if (auto symbol = expr.getSymbolReference()) {
            if (symbol->kind != SymbolKind::StatementBlock &&
                symbol->kind != SymbolKind::Subroutine) {
                context.addDiag(diag::InvalidBlockEventTarget, evSyntax.name->sourceRange());
                return false;
            }

            events.push_back({&expr, evSyntax.keyword.kind == TokenKind::BeginKeyword});
            return true;
        }

        return false;
    };

    const BlockEventExpressionSyntax* curr = &syntax;
    while (curr->kind == SyntaxKind::BinaryBlockEventExpression) {
        auto& bin = curr->as<BinaryBlockEventExpressionSyntax>();
        if (!addEvent(bin.left->as<PrimaryBlockEventExpressionSyntax>()))
            return badCtrl(comp, nullptr);

        curr = bin.right;
    }

    if (!addEvent(curr->as<PrimaryBlockEventExpressionSyntax>()))
        return badCtrl(comp, nullptr);

    return *comp.emplace<BlockEventListControl>(events.copy(comp), syntax.sourceRange());
}